

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::StartReceiverReport
          (RTCPCompoundPacketBuilder *this,uint32_t senderssrc)

{
  size_t sVar1;
  size_t sVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  size_t sVar5;
  uint32_t *ssrc;
  size_t neededsize;
  size_t sizeleft;
  size_t totalsize;
  uint32_t senderssrc_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    this_local._4_4_ = -0x2a;
  }
  else if ((this->report).headerlength == 0) {
    sVar1 = this->byesize;
    sVar2 = this->appsize;
    sVar5 = SDES::NeededBytes(&this->sdes);
    if (this->maximumpacketsize - (sVar1 + sVar2 + sVar5) < 8) {
      this_local._4_4_ = -0x2b;
    }
    else {
      (this->report).headerlength = 4;
      (this->report).isSR = false;
      puVar3 = (uint32_t *)(this->report).headerdata;
      uVar4 = htonl(senderssrc);
      *puVar3 = uVar4;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -0x21;
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::StartReceiverReport(uint32_t senderssrc)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (report.headerlength != 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYGOTREPORT;

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalsize = byesize+appsize+sdes.NeededBytes();
#else
	size_t totalsize = byesize+appsize+unknownsize+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sizeleft = maximumpacketsize-totalsize;
	size_t neededsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t);
	
	if (neededsize > sizeleft)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;
	
	// fill in some things

	report.headerlength = sizeof(uint32_t);
	report.isSR = false;
	
	uint32_t *ssrc = (uint32_t *)report.headerdata;
	*ssrc = htonl(senderssrc);

	return 0;
}